

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::SolveBeforeConstraintSyntax::SolveBeforeConstraintSyntax
          (SolveBeforeConstraintSyntax *this,Token solve,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *beforeExpr,Token before,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *afterExpr,Token semi)

{
  Token TVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ExpressionSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2_1;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *beforeExpr_local;
  SolveBeforeConstraintSyntax *this_local;
  Token before_local;
  Token solve_local;
  
  TVar1 = semi;
  uVar5 = before._0_8_;
  uVar4 = solve._0_8_;
  ConstraintItemSyntax::ConstraintItemSyntax
            (&this->super_ConstraintItemSyntax,SolveBeforeConstraint);
  (this->solve).kind = (short)uVar4;
  (this->solve).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->solve).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->solve).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->solve).info = solve.info;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&this->beforeExpr,beforeExpr);
  (this->before).kind = (short)uVar5;
  (this->before).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->before).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->before).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->before).info = before.info;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&this->afterExpr,afterExpr);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->beforeExpr);
  _child = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->beforeExpr);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::ExpressionSyntax_*> *)&child
                        );
    if (!bVar2) break;
    pEVar3 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
  }
  (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->afterExpr);
  _child_1 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->afterExpr);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2_1.index,
                         (iterator_base<slang::syntax::ExpressionSyntax_*> *)&child_1);
    if (!bVar2) break;
    pEVar3 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2_1.index);
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2_1.index);
  }
  return;
}

Assistant:

SolveBeforeConstraintSyntax(Token solve, const SeparatedSyntaxList<ExpressionSyntax>& beforeExpr, Token before, const SeparatedSyntaxList<ExpressionSyntax>& afterExpr, Token semi) :
        ConstraintItemSyntax(SyntaxKind::SolveBeforeConstraint), solve(solve), beforeExpr(beforeExpr), before(before), afterExpr(afterExpr), semi(semi) {
        this->beforeExpr.parent = this;
        for (auto child : this->beforeExpr)
            child->parent = this;
        this->afterExpr.parent = this;
        for (auto child : this->afterExpr)
            child->parent = this;
    }